

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table::dbClose(Table *this)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  ostream *this_00;
  uint local_14;
  int result;
  uint32_t i;
  Table *this_local;
  
  uVar1 = Pager::getNumOfPages(this->pager);
  std::ostream::operator<<((ostream *)&std::cout,uVar1);
  for (local_14 = 0; uVar1 = Pager::getNumOfPages(this->pager), local_14 < uVar1;
      local_14 = local_14 + 1) {
    pcVar3 = Pager::getPage(this->pager,local_14);
    if (pcVar3 != (char *)0x0) {
      Pager::_flush(this->pager,local_14);
    }
  }
  iVar2 = Pager::_close(this->pager);
  if (iVar2 != -1) {
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Error closing file. Exiting...");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void Table::dbClose() {
	std::cout << pager->getNumOfPages();
	for (uint32_t i = 0; i < pager->getNumOfPages(); ++i) {
		if (pager->getPage(i) == nullptr)
			continue;
		pager->_flush(i);
	}

	int result = pager->_close();
	if (result == -1) {
		std::cout << "Error closing file. Exiting..." << std::endl;
		exit(EXIT_FAILURE);
	}
}